

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

bool __thiscall tcmalloc::PageHeap::CheckSmallList(PageHeap *this)

{
  void ***pppvVar1;
  void **ppvVar2;
  uint64_t uVar3;
  Span *pSVar4;
  Span *pSVar5;
  long lVar6;
  uint64_t uVar7;
  int iVar8;
  ulong uVar9;
  
  lVar6 = 0;
  uVar3 = 0;
  uVar7 = 0;
  do {
    iVar8 = (int)this->small_normal_size_[lVar6];
    for (pSVar4 = this->small_normal_[lVar6].next; pSVar4 != this->small_normal_ + lVar6;
        pSVar4 = pSVar4->next) {
      if (iVar8 < 1) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ab,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (pSVar4->location != 1) {
        __assert_fail("span->location == Span::IN_NORMAL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ac,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar9 = pSVar4->page_id;
      pppvVar1 = (this->page_map_).roots[uVar9 >> 0x2a];
      if ((pppvVar1 == (void ***)0x0) ||
         (ppvVar2 = pppvVar1[(uint)(uVar9 >> 0x14) & 0x3fffff], ppvVar2 == (void **)0x0)) {
        pSVar5 = (Span *)0x0;
      }
      else {
        pSVar5 = (Span *)ppvVar2[(uint)uVar9 & 0xfffff];
      }
      if (pSVar5 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ad,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar9 = (uVar9 + pSVar4->npages) - 1;
      pppvVar1 = (this->page_map_).roots[uVar9 >> 0x2a];
      if ((pppvVar1 == (void ***)0x0) ||
         (ppvVar2 = pppvVar1[(uint)(uVar9 >> 0x14) & 0x3fffff], ppvVar2 == (void **)0x0)) {
        pSVar5 = (Span *)0x0;
      }
      else {
        pSVar5 = (Span *)ppvVar2[(uint)uVar9 & 0xfffff];
      }
      if (pSVar5 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ae,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar7 = uVar7 + pSVar4->npages * 0x2000;
      iVar8 = iVar8 + -1;
    }
    if (iVar8 != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1b1,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    iVar8 = (int)this->small_returned_size_[lVar6];
    for (pSVar4 = this->small_returned_[lVar6].next; pSVar4 != this->small_returned_ + lVar6;
        pSVar4 = pSVar4->next) {
      if (iVar8 < 1) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b5,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (pSVar4->location != 2) {
        __assert_fail("span->location == Span::IN_RETURNED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b6,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar9 = pSVar4->page_id;
      pppvVar1 = (this->page_map_).roots[uVar9 >> 0x2a];
      if ((pppvVar1 == (void ***)0x0) ||
         (ppvVar2 = pppvVar1[(uint)(uVar9 >> 0x14) & 0x3fffff], ppvVar2 == (void **)0x0)) {
        pSVar5 = (Span *)0x0;
      }
      else {
        pSVar5 = (Span *)ppvVar2[(uint)uVar9 & 0xfffff];
      }
      if (pSVar5 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b7,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar9 = (uVar9 + pSVar4->npages) - 1;
      pppvVar1 = (this->page_map_).roots[uVar9 >> 0x2a];
      if ((pppvVar1 == (void ***)0x0) ||
         (ppvVar2 = pppvVar1[(uint)(uVar9 >> 0x14) & 0x3fffff], ppvVar2 == (void **)0x0)) {
        pSVar5 = (Span *)0x0;
      }
      else {
        pSVar5 = (Span *)ppvVar2[(uint)uVar9 & 0xfffff];
      }
      if (pSVar5 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b8,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar3 = uVar3 + pSVar4->npages * 0x2000;
      iVar8 = iVar8 + -1;
    }
    if (iVar8 != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1bb,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x80) {
      if (uVar7 != (this->stat).small_normal_bytes) {
        __assert_fail("small_normal_bytes == stat.small_normal_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1be,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (uVar3 == (this->stat).small_returned_bytes) {
        return true;
      }
      __assert_fail("small_returned_bytes == stat.small_returned_bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1bf,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
  } while( true );
}

Assistant:

bool CheckSmallList() {
        uint64_t small_normal_bytes = 0;
        uint64_t small_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_normal_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_returned_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
        }

        assert(small_normal_bytes == stat.small_normal_bytes);
        assert(small_returned_bytes == stat.small_returned_bytes);
        return true;
    }